

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  string_view exec_name;
  string_view exec_name_00;
  string_view exec_name_01;
  int iVar1;
  ulong uVar2;
  char **in_RSI;
  int in_EDI;
  runtime_error *ex;
  error_t *ex_1;
  UrsaClient client;
  int c;
  bool raw_json;
  bool is_interactive;
  string db_command;
  string server_addr;
  size_t in_stack_fffffffffffffe28;
  UrsaClient *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe40;
  char *this;
  UrsaClient *this_00;
  string *in_stack_fffffffffffffe68;
  undefined6 in_stack_fffffffffffffe70;
  undefined1 in_stack_fffffffffffffe76;
  undefined1 in_stack_fffffffffffffe77;
  string *in_stack_fffffffffffffe78;
  UrsaClient *in_stack_fffffffffffffe80;
  string local_158 [212];
  undefined4 local_84;
  int local_70;
  undefined1 local_6a;
  undefined1 local_69;
  string local_68 [55];
  undefined1 local_31 [33];
  char **local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  this_00 = (UrsaClient *)local_31;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffe77,
                      CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
             (char *)in_stack_fffffffffffffe68,(allocator<char> *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  std::__cxx11::string::string(local_68);
  iVar1 = isatty(0);
  local_69 = iVar1 != 0;
  local_6a = 0;
  while (local_70 = getopt(local_8,local_10,"hqjc:"), local_70 != -1) {
    switch(local_70) {
    case 99:
      std::__cxx11::string::operator=(local_68,_optarg);
      break;
    default:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      exec_name_00._M_str = (char *)in_stack_fffffffffffffe30;
      exec_name_00._M_len = in_stack_fffffffffffffe28;
      print_usage(exec_name_00);
      spdlog::error<char[30]>((char (*) [30])0x121434);
      local_4 = 1;
      local_84 = 1;
      goto LAB_00121750;
    case 0x68:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
      exec_name._M_str = (char *)in_stack_fffffffffffffe30;
      exec_name._M_len = in_stack_fffffffffffffe28;
      print_usage(exec_name);
      local_4 = 0;
      local_84 = 1;
      goto LAB_00121750;
    case 0x6a:
      local_6a = 1;
      break;
    case 0x71:
      local_69 = 0;
    }
  }
  if (local_8 - _optind < 2) {
    if (local_8 - _optind == 1) {
      std::__cxx11::string::operator=((string *)(local_31 + 1),local_10[_optind]);
    }
    std::__cxx11::string::string(local_158,(string *)(local_31 + 1));
    UrsaClient::UrsaClient
              (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,(bool)in_stack_fffffffffffffe77,
               (bool)in_stack_fffffffffffffe76);
    std::__cxx11::string::~string(local_158);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      UrsaClient::one_shot_command
                ((UrsaClient *)
                 CONCAT17(in_stack_fffffffffffffe77,
                          CONCAT16(in_stack_fffffffffffffe76,in_stack_fffffffffffffe70)),
                 in_stack_fffffffffffffe68);
    }
    else {
      UrsaClient::start(this_00);
    }
    UrsaClient::~UrsaClient(in_stack_fffffffffffffe30);
    local_84 = 0;
  }
  else {
    spdlog::error<char[40]>((char (*) [40])0x121477);
    if (local_8 < 1) {
      this = "ursacli";
    }
    else {
      this = *local_10;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this,in_stack_fffffffffffffe38);
    exec_name_01._M_str = (char *)in_stack_fffffffffffffe30;
    exec_name_01._M_len = in_stack_fffffffffffffe28;
    print_usage(exec_name_01);
    local_4 = 1;
    local_84 = 1;
  }
LAB_00121750:
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  return local_4;
}

Assistant:

int main(int argc, char *argv[]) {
    std::string server_addr = "tcp://localhost:9281";
    std::string db_command;
    bool is_interactive = isatty(STDIN_FILENO) != 0;
    bool raw_json = false;

    int c;

    while ((c = getopt(argc, argv, "hqjc:")) != -1) {
        switch (c) {
            case 'q':
                is_interactive = false;
                break;
            case 'c':
                db_command = optarg;
                break;
            case 'j':
                raw_json = true;
                break;
            case 'h':
                print_usage(argc >= 1 ? argv[0] : "ursacli");
                return 0;
            default:
                print_usage(argc >= 1 ? argv[0] : "ursacli");
                spdlog::error("Failed to parse command line.");
                return 1;
        }
    }

    if (argc - optind > 1) {
        spdlog::error("Too many positional arguments provided.");
        print_usage(argc >= 1 ? argv[0] : "ursacli");
        return 1;
    }
    if (argc - optind == 1) {
        server_addr = argv[optind];
    }

    try {
        UrsaClient client(std::move(server_addr), is_interactive, raw_json);
        if (!db_command.empty()) {
            client.one_shot_command(db_command);
        } else {
            client.start();
        }
    } catch (const std::runtime_error &ex) {
        spdlog::error("Runtime error: {}", ex.what());
        return 1;
    } catch (const zmq::error_t &ex) {
        spdlog::error("ZeroMQ error: {}", ex.what());
        return 1;
    }
}